

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall Coverage_sha1_Test::Coverage_sha1_Test(Coverage_sha1_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012d0e8;
  return;
}

Assistant:

TEST(Coverage, sha1)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/algebraic_eqn_const_var_on_rhs/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();
    auto generatorProfile = libcellml::GeneratorProfile::create();

    generator->setModel(analyserModel);
    generator->setProfile(generatorProfile);

    std::string xs = {};

    for (int i = 0; i < 64; ++i) {
        xs += "x";
        // Note: the x's eventually ensure 100% coverage in our SHA-1 utility.

        generatorProfile->setVoiString(xs);

        generator->implementationCode();
    }
}